

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

int telemetry_messenger_get_send_status
              (TELEMETRY_MESSENGER_HANDLE messenger_handle,
              TELEMETRY_MESSENGER_SEND_STATUS *send_status)

{
  LOGGER_LOG p_Var1;
  LIST_ITEM_HANDLE pLVar2;
  LIST_ITEM_HANDLE pLVar3;
  LIST_ITEM_HANDLE ip_list_head;
  LIST_ITEM_HANDLE wts_list_head;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  TELEMETRY_MESSENGER_SEND_STATUS *send_status_local;
  TELEMETRY_MESSENGER_HANDLE messenger_handle_local;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_get_send_status",0x632,1,
                "telemetry_messenger_get_send_status failed (messenger_handle is NULL)");
    }
    l._4_4_ = 0x633;
  }
  else if (send_status == (TELEMETRY_MESSENGER_SEND_STATUS *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_get_send_status",0x637,1,
                "telemetry_messenger_get_send_status failed (send_status is NULL)");
    }
    l._4_4_ = 0x638;
  }
  else {
    pLVar2 = singlylinkedlist_get_head_item(messenger_handle->waiting_to_send);
    pLVar3 = singlylinkedlist_get_head_item(messenger_handle->in_progress_list);
    if ((pLVar2 == (LIST_ITEM_HANDLE)0x0) && (pLVar3 == (LIST_ITEM_HANDLE)0x0)) {
      *send_status = TELEMETRY_MESSENGER_SEND_STATUS_IDLE;
    }
    else {
      *send_status = TELEMETRY_MESSENGER_SEND_STATUS_BUSY;
    }
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int telemetry_messenger_get_send_status(TELEMETRY_MESSENGER_HANDLE messenger_handle, TELEMETRY_MESSENGER_SEND_STATUS* send_status)
{
    int result;

    if (messenger_handle == NULL)
    {
        LogError("telemetry_messenger_get_send_status failed (messenger_handle is NULL)");
        result = MU_FAILURE;
    }
    else if (send_status == NULL)
    {
        LogError("telemetry_messenger_get_send_status failed (send_status is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;
        LIST_ITEM_HANDLE wts_list_head = singlylinkedlist_get_head_item(instance->waiting_to_send);
        LIST_ITEM_HANDLE ip_list_head = singlylinkedlist_get_head_item(instance->in_progress_list);

        if (wts_list_head == NULL && ip_list_head == NULL)
        {
            *send_status = TELEMETRY_MESSENGER_SEND_STATUS_IDLE;
        }
        else
        {
            *send_status = TELEMETRY_MESSENGER_SEND_STATUS_BUSY;
        }

        result = RESULT_OK;
    }

    return result;
}